

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

bool __thiscall
QHashPrivate::
iterator<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
::isUnused(iterator<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
           *this)

{
  Span *pSVar1;
  bool bVar2;
  size_t sVar3;
  char *i;
  int __c;
  char *in_RSI;
  iterator<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
  *in_RDI;
  
  pSVar1 = in_RDI->d->spans;
  sVar3 = span(in_RDI);
  i = index(in_RDI,in_RSI,__c);
  bVar2 = Span<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
          ::hasNode(pSVar1 + sVar3,(size_t)i);
  return (bool)((bVar2 ^ 0xffU) & 1);
}

Assistant:

inline bool isUnused() const noexcept { return !d->spans[span()].hasNode(index()); }